

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shm-sync-common.c
# Opt level: O0

void sync_notify(Sync *sync)

{
  int iVar1;
  long in_RDI;
  
  iVar1 = pthread_cond_signal((pthread_cond_t *)(in_RDI + 0x28));
  if (iVar1 != 0) {
    throw((char *)0x1026e3);
  }
  return;
}

Assistant:

void sync_notify(struct Sync* sync) {
	// Signals to a single thread waiting on the condition variable
	// to wake up, if any such thread exists. An alternative would be
	// to call pthread_cond_broadcast, in which case *all* waiting
	// threads would be woken up.
	if (pthread_cond_signal(&sync->condition) != 0) {
		throw("Error signalling condition variable");
	}
}